

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_bool lzma_index_iter_next(lzma_index_iter *iter,lzma_index_iter_mode mode)

{
  size_t sVar1;
  void *pvVar2;
  index_tree_node *node;
  index_tree_node *node_00;
  index_tree_node *piVar3;
  
  if (LZMA_INDEX_ITER_NONEMPTY_BLOCK < mode) {
    return '\x01';
  }
  sVar1 = iter->internal[0].s;
  node_00 = (index_tree_node *)iter->internal[1].p;
  piVar3 = (index_tree_node *)iter->internal[3].s;
  if (mode != LZMA_INDEX_ITER_STREAM) {
    pvVar2 = iter->internal[4].p;
    if (pvVar2 == (void *)0x2) {
      node = node_00[1].left;
      goto LAB_003ae396;
    }
    if (pvVar2 == (void *)0x1) {
      node = (index_tree_node *)index_tree_next((index_tree_node *)iter->internal[2].p);
      goto LAB_003ae396;
    }
    if (pvVar2 == (void *)0x0) {
      node = (index_tree_node *)iter->internal[2].p;
      goto LAB_003ae396;
    }
  }
  node = (index_tree_node *)0x0;
LAB_003ae396:
  do {
    if (node_00 == (index_tree_node *)0x0) {
      node_00 = *(index_tree_node **)(sVar1 + 8);
      if (mode < LZMA_INDEX_ITER_BLOCK) {
LAB_003ae463:
        node = node_00[1].left;
        goto LAB_003ae467;
      }
      while (node = node_00[1].left, node == (index_tree_node *)0x0) {
        node_00 = (index_tree_node *)index_tree_next(node_00);
        if (node_00 == (index_tree_node *)0x0) {
          return '\x01';
        }
      }
LAB_003ae405:
      piVar3 = (index_tree_node *)0x0;
    }
    else {
      if (node == (index_tree_node *)0x0) goto LAB_003ae3e2;
      if (node[1].parent <= piVar3) {
        node = (index_tree_node *)index_tree_next(node);
        while (node == (index_tree_node *)0x0) {
LAB_003ae3e2:
          node_00 = (index_tree_node *)index_tree_next(node_00);
          if (node_00 == (index_tree_node *)0x0) {
            return '\x01';
          }
          if (mode < LZMA_INDEX_ITER_BLOCK) goto LAB_003ae463;
          node = node_00[1].left;
        }
        goto LAB_003ae405;
      }
      piVar3 = (index_tree_node *)((long)&piVar3->uncompressed_base + 1);
    }
    if (mode != LZMA_INDEX_ITER_NONEMPTY_BLOCK) goto LAB_003ae46a;
    if (piVar3 != (index_tree_node *)0x0) {
      if ((index_tree_node *)(&node[1].compressed_base)[(long)piVar3 * 2] !=
          (&node[1].left)[(long)piVar3 * 2]) goto LAB_003ae46a;
      goto LAB_003ae396;
    }
    if ((index_tree_node *)node->uncompressed_base != node[1].left) {
LAB_003ae467:
      piVar3 = (index_tree_node *)0x0;
LAB_003ae46a:
      iter->internal[1].p = node_00;
      iter->internal[2].p = node;
      iter->internal[3].s = (size_t)piVar3;
      iter_set_info(iter);
      return '\0';
    }
  } while( true );
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_next(lzma_index_iter *iter, lzma_index_iter_mode mode)
{
	// Catch unsupported mode values.
	if ((unsigned int)(mode) > LZMA_INDEX_ITER_NONEMPTY_BLOCK)
		return true;

	const lzma_index *i = iter->internal[ITER_INDEX].p;
	const index_stream *stream = iter->internal[ITER_STREAM].p;
	const index_group *group = NULL;
	size_t record = iter->internal[ITER_RECORD].s;

	// If we are being asked for the next Stream, leave group to NULL
	// so that the rest of the this function thinks that this Stream
	// has no groups and will thus go to the next Stream.
	if (mode != LZMA_INDEX_ITER_STREAM) {
		// Get the pointer to the current group. See iter_set_inf()
		// for explanation.
		switch (iter->internal[ITER_METHOD].s) {
		case ITER_METHOD_NORMAL:
			group = iter->internal[ITER_GROUP].p;
			break;

		case ITER_METHOD_NEXT:
			group = index_tree_next(iter->internal[ITER_GROUP].p);
			break;

		case ITER_METHOD_LEFTMOST:
			group = (const index_group *)(
					stream->groups.leftmost);
			break;
		}
	}

again:
	if (stream == NULL) {
		// We at the beginning of the lzma_index.
		// Locate the first Stream.
		stream = (const index_stream *)(i->streams.leftmost);
		if (mode >= LZMA_INDEX_ITER_BLOCK) {
			// Since we are being asked to return information
			// about the first a Block, skip Streams that have
			// no Blocks.
			while (stream->groups.leftmost == NULL) {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			}
		}

		// Start from the first Record in the Stream.
		group = (const index_group *)(stream->groups.leftmost);
		record = 0;

	} else if (group != NULL && record < group->last) {
		// The next Record is in the same group.
		++record;

	} else {
		// This group has no more Records or this Stream has
		// no Blocks at all.
		record = 0;

		// If group is not NULL, this Stream has at least one Block
		// and thus at least one group. Find the next group.
		if (group != NULL)
			group = index_tree_next(&group->node);

		if (group == NULL) {
			// This Stream has no more Records. Find the next
			// Stream. If we are being asked to return information
			// about a Block, we skip empty Streams.
			do {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			} while (mode >= LZMA_INDEX_ITER_BLOCK
					&& stream->groups.leftmost == NULL);

			group = (const index_group *)(
					stream->groups.leftmost);
		}
	}

	if (mode == LZMA_INDEX_ITER_NONEMPTY_BLOCK) {
		// We need to look for the next Block again if this Block
		// is empty.
		if (record == 0) {
			if (group->node.uncompressed_base
					== group->records[0].uncompressed_sum)
				goto again;
		} else if (group->records[record - 1].uncompressed_sum
				== group->records[record].uncompressed_sum) {
			goto again;
		}
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = record;

	iter_set_info(iter);

	return false;
}